

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O0

int __thiscall ON_Polyline::Clean(ON_Polyline *this,double tolerance)

{
  int iVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  int local_24;
  int local_20;
  int j;
  int i;
  int count0;
  double tolerance_local;
  ON_Polyline *this_local;
  
  iVar1 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (2 < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count) {
    local_24 = 0;
    for (local_20 = 1;
        local_20 < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -1;
        local_20 = local_20 + 1) {
      dVar5 = ON_3dPoint::DistanceTo
                        ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
                         local_24,(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a
                                  + local_20);
      if ((tolerance < dVar5) && (local_24 = local_24 + 1, local_24 < local_20)) {
        pOVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + local_20;
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + local_24;
        pOVar3->x = pOVar4->x;
        pOVar3->y = pOVar4->y;
        pOVar3->z = pOVar4->z;
      }
    }
    if (local_24 + 2 < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      pOVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
               ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -1);
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + (local_24 + 1);
      pOVar3->x = pOVar4->x;
      pOVar3->y = pOVar4->y;
      pOVar3->z = pOVar4->z;
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = local_24 + 2;
    }
    while( true ) {
      bVar2 = false;
      if (2 < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count) {
        dVar5 = ON_3dPoint::DistanceTo
                          ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
                           ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count +
                           -2),(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
                               ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.
                                m_count + -1));
        bVar2 = dVar5 <= tolerance;
      }
      if (!bVar2) break;
      pOVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
               ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -1);
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
               ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -2);
      pOVar3->x = pOVar4->x;
      pOVar3->y = pOVar4->y;
      pOVar3->z = pOVar4->z;
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count =
           (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -1;
    }
  }
  return iVar1 - (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
}

Assistant:

int ON_Polyline::Clean( double tolerance )
{
  // 14 January 2005 Dale Lear
  //     Fixed this cleaner so that it did not modify
  //     the start and end point.
  int count0 = m_count;

  if ( m_count > 2 )
  {
    int i,j;
    j = 0;
    for ( i = 1; i < m_count-1; i++ )
    {
       if ( m_a[j].DistanceTo(m_a[i]) <= tolerance )
         continue;
       j++;
       if ( i > j )
         m_a[j] = m_a[i];
    }

    if ( m_count > j+2 )
    {
      m_a[j+1] = m_a[m_count-1];
      m_count = j+2;
    }

    while ( m_count > 2 && m_a[m_count-2].DistanceTo(m_a[m_count-1]) <= tolerance )
    {
      m_a[m_count-2] = m_a[m_count-1];
      m_count--;
    }
  }

  return count0-m_count;
}